

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O1

void duckdb::StringStats::Update(BaseStatistics *stats,string_t *value)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  UnicodeType UVar4;
  long lVar5;
  InvalidInputException *__return_storage_ptr__;
  char *s;
  size_t __n;
  ulong len;
  bool bVar6;
  data_t target [8];
  undefined8 local_78;
  string local_70;
  string local_50;
  
  uVar3 = (value->value).pointer.length;
  len = (ulong)uVar3;
  if (len < 0xd) {
    s = (value->value).pointer.prefix;
  }
  else {
    s = (value->value).pointer.ptr;
  }
  __n = 8;
  if (len < 8) {
    __n = len;
  }
  switchD_00b1422a::default(&local_78,s,__n);
  if (len < 8) {
    switchD_005700f1::default((void *)((long)&local_78 + __n),0,8 - __n);
  }
  lVar5 = -7;
  do {
    bVar1 = *(byte *)((long)&local_78 + lVar5 + 7);
    bVar2 = *(byte *)((long)&stats->stats_union + lVar5 + 7);
    if (bVar1 < bVar2) goto LAB_005fa6aa;
  } while ((bVar1 <= bVar2) && (bVar6 = lVar5 != 0, lVar5 = lVar5 + 1, bVar6));
  if (bVar1 < bVar2) {
LAB_005fa6aa:
    *(undefined8 *)(stats->stats_union).string_data.min = local_78;
  }
  lVar5 = 0;
  do {
    bVar1 = *(byte *)((long)&stats->stats_union + lVar5 + 8);
    if (*(byte *)((long)&local_78 + lVar5) < bVar1) break;
    if (bVar1 < *(byte *)((long)&local_78 + lVar5)) {
      *(undefined8 *)((long)&stats->stats_union + 8) = local_78;
      break;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  if ((stats->stats_union).string_data.max_string_length < uVar3) {
    (stats->stats_union).string_data.max_string_length = uVar3;
  }
  if (((stats->type).id_ == VARCHAR) && ((stats->stats_union).string_data.has_unicode == false)) {
    UVar4 = Utf8Proc::Analyze(s,len,(UnicodeInvalidReason *)0x0,(size_t *)0x0);
    if (UVar4 == UNICODE) {
      (stats->stats_union).string_data.has_unicode = true;
    }
    else if (UVar4 == INVALID) {
      __return_storage_ptr__ = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,s,s + len);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"segment statistics update","");
      ErrorManager::InvalidUnicodeError(__return_storage_ptr__,&local_50,&local_70);
      __cxa_throw(__return_storage_ptr__,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void StringStats::Update(BaseStatistics &stats, const string_t &value) {
	auto data = const_data_ptr_cast(value.GetData());
	auto size = value.GetSize();

	//! we can only fit 8 bytes, so we might need to trim our string
	// construct the value
	data_t target[StringStatsData::MAX_STRING_MINMAX_SIZE];
	ConstructValue(data, size, target);

	// update the min and max
	auto &string_data = StringStats::GetDataUnsafe(stats);
	if (StringValueComparison(target, StringStatsData::MAX_STRING_MINMAX_SIZE, string_data.min) < 0) {
		memcpy(string_data.min, target, StringStatsData::MAX_STRING_MINMAX_SIZE);
	}
	if (StringValueComparison(target, StringStatsData::MAX_STRING_MINMAX_SIZE, string_data.max) > 0) {
		memcpy(string_data.max, target, StringStatsData::MAX_STRING_MINMAX_SIZE);
	}
	if (size > string_data.max_string_length) {
		string_data.max_string_length = UnsafeNumericCast<uint32_t>(size);
	}
	if (stats.GetType().id() == LogicalTypeId::VARCHAR && !string_data.has_unicode) {
		auto unicode = Utf8Proc::Analyze(const_char_ptr_cast(data), size);
		if (unicode == UnicodeType::UNICODE) {
			string_data.has_unicode = true;
		} else if (unicode == UnicodeType::INVALID) {
			throw ErrorManager::InvalidUnicodeError(string(const_char_ptr_cast(data), size),
			                                        "segment statistics update");
		}
	}
}